

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExternInterfaceMethodSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExternInterfaceMethodSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,FunctionPrototypeSyntax *args_3,Token *args_4)

{
  Token forkJoin;
  Token externKeyword;
  Token semi;
  ExternInterfaceMethodSyntax *pEVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Info *in_R9;
  size_t in_stack_ffffffffffffff88;
  ExternInterfaceMethodSyntax *in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pEVar1 = (ExternInterfaceMethodSyntax *)
           allocate(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff88);
  externKeyword.info = (Info *)*in_RCX;
  externKeyword._0_8_ = in_R9->location;
  forkJoin.info = (Info *)in_R9->rawTextPtr;
  forkJoin._0_8_ = pEVar1;
  semi.info = in_R9;
  semi._0_8_ = in_RDX[1];
  slang::syntax::ExternInterfaceMethodSyntax::ExternInterfaceMethodSyntax
            (in_stack_ffffffffffffff90,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_R9->location,externKeyword,
             forkJoin,(FunctionPrototypeSyntax *)*in_RDX,semi);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }